

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O1

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* xemmai::t_module::f_execute_script
            (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             *__return_storage_ptr__,t_object *a_code)

{
  t_heap<xemmai::t_object> *this;
  t_type *ptVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_pvalue *ptVar2;
  t_object *ptVar3;
  t_object *ptVar4;
  char *pcVar5;
  size_t sVar6;
  long in_FS_OFFSET;
  t_fields fields;
  t_object *in_stack_ffffffffffffffa8;
  t_object *in_stack_ffffffffffffffb0;
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  vStack_40;
  
  ptVar1 = *(t_type **)(*(long *)(in_FS_OFFSET + -0x78) + 0xd8);
  this = (t_heap<xemmai::t_object> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x30);
  sVar6 = ptVar1->v_instance_fields * 0x10 + 0x58;
  if (sVar6 < 0x81) {
    ptVar3 = *(t_object **)(in_FS_OFFSET + -0x58);
    if (ptVar3 == (t_object *)0x0) {
      ptVar3 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x90),this);
      ptVar4 = ptVar3->v_next;
    }
    else {
      ptVar4 = ptVar3->v_next;
    }
    *(t_object **)(in_FS_OFFSET + -0x58) = ptVar4;
  }
  else {
    ptVar3 = t_heap<xemmai::t_object>::f_allocate_medium(this,sVar6);
  }
  ptVar3->v_next = (t_object *)0x0;
  sVar6 = ptVar1->v_instance_fields;
  if (sVar6 != 0) {
    pcVar5 = ptVar3->v_data;
    do {
      pcVar5 = pcVar5 + 0x10;
      pcVar5[0] = '\0';
      pcVar5[1] = '\0';
      pcVar5[2] = '\0';
      pcVar5[3] = '\0';
      pcVar5[4] = '\0';
      pcVar5[5] = '\0';
      pcVar5[6] = '\0';
      pcVar5[7] = '\0';
      sVar6 = sVar6 - 1;
    } while (sVar6 != 0);
  }
  ptVar3->v_data[0] = '\0';
  ptVar3->v_data[1] = '\0';
  ptVar3->v_data[2] = '\0';
  ptVar3->v_data[3] = '\0';
  ptVar3->v_data[4] = '\0';
  ptVar3->v_data[5] = '\0';
  ptVar3->v_data[6] = '\0';
  ptVar3->v_data[7] = '\0';
  ptVar3->v_data[8] = '\0';
  ptVar3->v_data[9] = '\0';
  ptVar3->v_data[10] = '\0';
  ptVar3->v_data[0xb] = '\0';
  ptVar3->v_data[0xc] = '\0';
  ptVar3->v_data[0xd] = '\0';
  ptVar3->v_data[0xe] = '\0';
  ptVar3->v_data[0xf] = '\0';
  this_00 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *this_00->v_head = (t_object *)&ptVar1[-1].f_less;
  if (this_00->v_head == this_00->v_next) {
    t_slot::t_queue<128UL>::f_next(this_00);
  }
  else {
    this_00->v_head = this_00->v_head + 1;
  }
  ptVar3->v_type = ptVar1;
  this_01 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *this_01->v_head = ptVar3;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<256UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  ptVar3 = t_lambda::f_instantiate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  vStack_40.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_40.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_40.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ptVar4 = f_new<xemmai::t_builder,xemmai::t_global>(*(t_global **)(in_FS_OFFSET + -0x78));
  *(undefined1 **)(ptVar4->v_data + 8) = &stack0xffffffffffffffa8;
  ptVar2 = *(t_pvalue **)(in_FS_OFFSET + -0x30);
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar2 + 2;
  ptVar2[1].super_t_pointer.v_p = ptVar4;
  (*ptVar3->v_type->f_call)(ptVar3,ptVar2,0);
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar2;
  ptVar4->v_data[8] = '\0';
  ptVar4->v_data[9] = '\0';
  ptVar4->v_data[10] = '\0';
  ptVar4->v_data[0xb] = '\0';
  ptVar4->v_data[0xc] = '\0';
  ptVar4->v_data[0xd] = '\0';
  ptVar4->v_data[0xe] = '\0';
  ptVar4->v_data[0xf] = '\0';
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::vector(__return_storage_ptr__,&vStack_40);
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector(&vStack_40);
  std::vector<xemmai::t_root,_std::allocator<xemmai::t_root>_>::~vector
            ((vector<xemmai::t_root,_std::allocator<xemmai::t_root>_> *)&stack0xffffffffffffffa8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_module::f_execute_script(t_object* a_code)
{
	auto lambda = t_lambda::f_instantiate(xemmai::f_new<t_scope>(f_global()), a_code);
	t_fields fields;
	t_builder::f_do(fields, [&](auto builder)
	{
		t_scoped_stack stack(2);
		stack[1] = builder;
		lambda->f_call_without_loop(stack, 0);
	});
	return fields.v_class;
}